

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ColColDAGNode::assignPrimitive_(ColColDAGNode *this)

{
  uint uVar1;
  invalid_argument *this_00;
  
  uVar1 = this->op_ - 1;
  if (uVar1 < 3) {
    this->primitive =
         (_func_uint32_t_uint32_t_int32_t_ptr_int32_t_ptr_int32_t_ptr_uint32_t_ptr *)
         (&PTR_map_add_int32_col_int32_col_00106d98)[uVar1];
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Unkonwn op");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void assignPrimitive_() {
        switch (op_)
        {
            case OP_ADD:
                primitive = map_add_int32_col_int32_col;
                break;

            case OP_MUL:
                primitive = map_mul_int32_col_int32_col;
                break;

            case OP_SUB:
                primitive = map_sub_int32_col_int32_col;
                break;

            default:
                throw std::invalid_argument("Unkonwn op");
        }
    }